

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O2

shared_ptr<LNode> __thiscall LParser::shift_EOFF(LParser *this)

{
  LParser *in_RSI;
  shared_ptr<LNode> sVar1;
  
  move(in_RSI);
  sVar1 = std::make_shared<LNode,LNodeType>((LNodeType *)this);
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::shift_EOFF() {
    this->move();
    return std::make_shared<LNode>(LNodeType::EOFF);
}